

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

void joypad_init_file_data(JoypadBuffer *buffer,FileData *file_data)

{
  size_t sVar1;
  u8 *puVar2;
  FileData *file_data_local;
  JoypadBuffer *buffer_local;
  
  sVar1 = joypad_file_size(buffer);
  file_data->size = sVar1;
  puVar2 = (u8 *)malloc(file_data->size);
  file_data->data = puVar2;
  return;
}

Assistant:

void joypad_init_file_data(JoypadBuffer* buffer, FileData* file_data) {
  file_data->size = joypad_file_size(buffer);
  file_data->data = xmalloc(file_data->size);
}